

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-prim-types.cc
# Opt level: O0

void prim_add_test(void)

{
  bool bVar1;
  allocator local_5b29;
  string local_5b28;
  undefined1 local_5b08 [8];
  Prim root;
  string local_57b0;
  undefined1 local_5790 [8];
  Prim dprim;
  string local_5438;
  undefined1 local_5418 [8];
  Prim cprim;
  string local_50c0;
  undefined1 local_50a0 [8];
  Prim bprim;
  string local_4d48;
  undefined1 local_4d28 [8];
  Prim aprim;
  Model rootmodel;
  Model dmodel;
  Model cmodel;
  undefined1 local_1d88 [8];
  Model bmodel;
  Model amodel;
  
  tinyusdz::Model::Model
            ((Model *)&bmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Model::Model((Model *)local_1d88);
  tinyusdz::Model::Model
            ((Model *)&dmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Model::Model
            ((Model *)&rootmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Model::Model
            ((Model *)&aprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4d48,"test01",
             (allocator *)
             ((long)&bprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  tinyusdz::Prim::Prim<tinyusdz::Model>
            ((Prim *)local_4d28,&local_4d48,
             (Model *)&bmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_4d48);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&bprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50c0,"test02",
             (allocator *)
             ((long)&cprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  tinyusdz::Prim::Prim<tinyusdz::Model>((Prim *)local_50a0,&local_50c0,(Model *)local_1d88);
  std::__cxx11::string::~string((string *)&local_50c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&cprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5438,"test01",
             (allocator *)
             ((long)&dprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  tinyusdz::Prim::Prim<tinyusdz::Model>
            ((Prim *)local_5418,&local_5438,
             (Model *)&dmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_5438);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_57b0,"test02",
             (allocator *)
             ((long)&root._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  tinyusdz::Prim::Prim<tinyusdz::Model>
            ((Prim *)local_5790,&local_57b0,
             (Model *)&rootmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_57b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&root._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b28,"root",&local_5b29);
  tinyusdz::Prim::Prim<tinyusdz::Model>
            ((Prim *)local_5b08,&local_5b28,
             (Model *)&aprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_5b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b29);
  bVar1 = tinyusdz::Prim::add_child((Prim *)local_5b08,(Prim *)local_4d28,true,(string *)0x0);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x84,"%s","root.add_child(std::move(aprim))");
  bVar1 = tinyusdz::Prim::add_child((Prim *)local_5b08,(Prim *)local_50a0,true,(string *)0x0);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x86,"%s","root.add_child(std::move(bprim))");
  bVar1 = tinyusdz::Prim::add_child((Prim *)local_5b08,(Prim *)local_5418,false,(string *)0x0);
  acutest_check_((byte)~bVar1 & 1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x89,"%s","!root.add_child(std::move(cprim), false)");
  bVar1 = tinyusdz::Prim::add_child((Prim *)local_5b08,(Prim *)local_5790,true,(string *)0x0);
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-prim-types.cc"
                 ,0x8c,"%s","root.add_child(std::move(dprim), true)");
  tinyusdz::Prim::~Prim((Prim *)local_5b08);
  tinyusdz::Prim::~Prim((Prim *)local_5790);
  tinyusdz::Prim::~Prim((Prim *)local_5418);
  tinyusdz::Prim::~Prim((Prim *)local_50a0);
  tinyusdz::Prim::~Prim((Prim *)local_4d28);
  tinyusdz::Model::~Model
            ((Model *)&aprim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  tinyusdz::Model::~Model
            ((Model *)&rootmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Model::~Model
            ((Model *)&dmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  tinyusdz::Model::~Model((Model *)local_1d88);
  tinyusdz::Model::~Model
            ((Model *)&bmodel._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void prim_add_test(void) {
  Model amodel;
  Model bmodel;
  Model cmodel;
  Model dmodel;
  Model rootmodel;

  Prim aprim("test01", amodel);
  Prim bprim("test02", bmodel);
  Prim cprim("test01", cmodel);
  Prim dprim("test02", dmodel);
  Prim root("root", rootmodel);

  TEST_CHECK(root.add_child(std::move(aprim)));

  TEST_CHECK(root.add_child(std::move(bprim)));

  // cannot add child Prim with same elementName
  TEST_CHECK(!root.add_child(std::move(cprim), /* rename_if_required */false)); 

  // can add child Prim with renaming
  TEST_CHECK(root.add_child(std::move(dprim), /* rename_if_required */true)); 
  
}